

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatchTest.cpp
# Opt level: O1

void __thiscall
oout::MatchTest::MatchTest(MatchTest *this,shared_ptr<const_oout::Text> *text,string *match)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  EqualMatch *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  shared_ptr<const_oout::Match> local_38;
  
  local_48 = (EqualMatch *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualMatch,std::allocator<oout::EqualMatch>,std::__cxx11::string_const&>
            (&_Stack_40,&local_48,(allocator<oout::EqualMatch> *)&local_38,match);
  this_00._M_pi = _Stack_40._M_pi;
  local_38.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_48->super_Match;
  local_38.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_40._M_pi;
  local_48 = (EqualMatch *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  MatchTest(this,text,&local_38);
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
  return;
}

Assistant:

MatchTest::MatchTest(
	const shared_ptr<const Text> &text,
	const string &match
) : MatchTest(text, make_shared<EqualMatch>(match))
{
}